

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ArrayPtr<unsigned_char> __thiscall kj::VectorOutputStream::getWriteBuffer(VectorOutputStream *this)

{
  uchar *puVar1;
  uchar *puVar2;
  size_t sVar3;
  ArrayPtr<unsigned_char> AVar4;
  VectorOutputStream *this_local;
  
  puVar1 = this->fillPos;
  puVar2 = Array<unsigned_char>::end(&this->vector);
  if (puVar1 == puVar2) {
    sVar3 = Array<unsigned_char>::size(&this->vector);
    grow(this,sVar3 + 1);
  }
  puVar1 = this->fillPos;
  puVar2 = Array<unsigned_char>::end(&this->vector);
  AVar4 = arrayPtr<unsigned_char>(puVar1,puVar2);
  return AVar4;
}

Assistant:

ArrayPtr<byte> VectorOutputStream::getWriteBuffer() {
  // Grow if needed.
  if (fillPos == vector.end()) {
    grow(vector.size() + 1);
  }

  return arrayPtr(fillPos, vector.end());
}